

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm.c
# Opt level: O0

char * sym_decorate(BuildCtx *ctx,char *prefix,char *suffix)

{
  char *pcVar1;
  size_t sVar2;
  char *symprefix;
  char *p;
  char name [256];
  char *suffix_local;
  char *prefix_local;
  BuildCtx *ctx_local;
  
  pcVar1 = "";
  if (ctx->mode == BUILD_machasm) {
    pcVar1 = "_";
  }
  sprintf((char *)&p,"%s%s%s",pcVar1,prefix,suffix);
  pcVar1 = strchr((char *)&p,0x40);
  if (pcVar1 != (char *)0x0) {
    *pcVar1 = '\0';
  }
  sVar2 = strlen((char *)&p);
  pcVar1 = (char *)malloc(sVar2 + 1);
  strcpy(pcVar1,(char *)&p);
  return pcVar1;
}

Assistant:

static const char *sym_decorate(BuildCtx *ctx,
				const char *prefix, const char *suffix)
{
  char name[256];
  char *p;
#if LJ_64
  const char *symprefix = ctx->mode == BUILD_machasm ? "_" : "";
#elif LJ_TARGET_XBOX360
  const char *symprefix = "";
#else
  const char *symprefix = ctx->mode != BUILD_elfasm ? "_" : "";
#endif
  sprintf(name, "%s%s%s", symprefix, prefix, suffix);
  p = strchr(name, '@');
  if (p) {
#if LJ_TARGET_X86ORX64
    if (!LJ_64 && (ctx->mode == BUILD_coffasm || ctx->mode == BUILD_peobj))
      name[0] = name[1] == 'R' ? '_' : '@';  /* Just for _RtlUnwind@16. */
    else
      *p = '\0';
#elif LJ_TARGET_PPC && !LJ_TARGET_CONSOLE
    /* Keep @plt etc. */
#else
    *p = '\0';
#endif
  }
  p = (char *)malloc(strlen(name)+1);  /* MSVC doesn't like strdup. */
  strcpy(p, name);
  return p;
}